

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize.h
# Opt level: O0

void stbir__decode_scanline(stbir__info *stbir_info,int n)

{
  int iVar1;
  int iVar2;
  stbir_datatype sVar3;
  stbir_colorspace sVar4;
  int max;
  stbir_edge edge;
  stbir_edge edge_00;
  void *pvVar5;
  int iVar6;
  int iVar7;
  float *pfVar8;
  long lVar9;
  float fVar10;
  float local_ac;
  float alpha;
  int decode_pixel_index_8;
  int input_pixel_index_7;
  int decode_pixel_index_7;
  int input_pixel_index_6;
  int decode_pixel_index_6;
  int input_pixel_index_5;
  int decode_pixel_index_5;
  int input_pixel_index_4;
  int decode_pixel_index_4;
  int input_pixel_index_3;
  int decode_pixel_index_3;
  int input_pixel_index_2;
  int decode_pixel_index_2;
  int input_pixel_index_1;
  int decode_pixel_index_1;
  int input_pixel_index;
  int decode_pixel_index;
  int x;
  int decode;
  int max_x;
  void *input_data;
  size_t in_buffer_row_offset;
  stbir_edge edge_vertical;
  stbir_edge edge_horizontal;
  float *decode_buffer;
  size_t input_stride_bytes;
  int input_w;
  int colorspace;
  int type;
  int alpha_channel;
  int channels;
  int c;
  int n_local;
  stbir__info *stbir_info_local;
  
  iVar1 = stbir_info->channels;
  iVar2 = stbir_info->alpha_channel;
  sVar3 = stbir_info->type;
  sVar4 = stbir_info->colorspace;
  max = stbir_info->input_w;
  iVar7 = stbir_info->input_stride_bytes;
  pfVar8 = stbir__get_decode_buffer(stbir_info);
  edge = stbir_info->edge_horizontal;
  edge_00 = stbir_info->edge_vertical;
  iVar6 = stbir__edge_wrap(edge_00,n,stbir_info->input_h);
  lVar9 = (long)iVar6 * (long)iVar7;
  pvVar5 = stbir_info->input_data;
  iVar7 = max + stbir_info->horizontal_filter_pixel_margin;
  input_pixel_index = -stbir_info->horizontal_filter_pixel_margin;
  if ((edge_00 == STBIR_EDGE_ZERO) && ((n < 0 || (stbir_info->input_h <= n)))) {
    for (; input_pixel_index < iVar7; input_pixel_index = input_pixel_index + 1) {
      for (alpha_channel = 0; alpha_channel < iVar1; alpha_channel = alpha_channel + 1) {
        pfVar8[input_pixel_index * iVar1 + alpha_channel] = 0.0;
      }
    }
  }
  else {
    switch(sVar3 * 2 + sVar4) {
    case STBIR_COLORSPACE_LINEAR:
      for (; input_pixel_index < iVar7; input_pixel_index = input_pixel_index + 1) {
        iVar6 = stbir__edge_wrap(edge,input_pixel_index,max);
        for (alpha_channel = 0; alpha_channel < iVar1; alpha_channel = alpha_channel + 1) {
          pfVar8[input_pixel_index * iVar1 + alpha_channel] =
               (float)*(byte *)((long)pvVar5 + (iVar6 * iVar1 + alpha_channel) + lVar9) / 255.0;
        }
      }
      break;
    case STBIR_COLORSPACE_SRGB:
      for (; input_pixel_index < iVar7; input_pixel_index = input_pixel_index + 1) {
        iVar6 = stbir__edge_wrap(edge,input_pixel_index,max);
        for (alpha_channel = 0; alpha_channel < iVar1; alpha_channel = alpha_channel + 1) {
          pfVar8[input_pixel_index * iVar1 + alpha_channel] =
               stbir__srgb_uchar_to_linear_float
               [*(byte *)((long)pvVar5 + (iVar6 * iVar1 + alpha_channel) + lVar9)];
        }
        if ((stbir_info->flags & 2) == 0) {
          pfVar8[input_pixel_index * iVar1 + iVar2] =
               (float)*(byte *)((long)pvVar5 + (iVar6 * iVar1 + iVar2) + lVar9) / 255.0;
        }
      }
      break;
    case STBIR_MAX_COLORSPACES:
      for (; input_pixel_index < iVar7; input_pixel_index = input_pixel_index + 1) {
        iVar6 = stbir__edge_wrap(edge,input_pixel_index,max);
        for (alpha_channel = 0; alpha_channel < iVar1; alpha_channel = alpha_channel + 1) {
          pfVar8[input_pixel_index * iVar1 + alpha_channel] =
               (float)*(ushort *)((long)pvVar5 + (long)(iVar6 * iVar1 + alpha_channel) * 2 + lVar9)
               / 65535.0;
        }
      }
      break;
    case STBIR_MAX_COLORSPACES|STBIR_COLORSPACE_SRGB:
      for (; input_pixel_index < iVar7; input_pixel_index = input_pixel_index + 1) {
        iVar6 = stbir__edge_wrap(edge,input_pixel_index,max);
        for (alpha_channel = 0; alpha_channel < iVar1; alpha_channel = alpha_channel + 1) {
          fVar10 = stbir__srgb_to_linear
                             ((float)*(ushort *)
                                      ((long)pvVar5 +
                                      (long)(iVar6 * iVar1 + alpha_channel) * 2 + lVar9) / 65535.0);
          pfVar8[input_pixel_index * iVar1 + alpha_channel] = fVar10;
        }
        if ((stbir_info->flags & 2) == 0) {
          pfVar8[input_pixel_index * iVar1 + iVar2] =
               (float)*(ushort *)((long)pvVar5 + (long)(iVar6 * iVar1 + iVar2) * 2 + lVar9) /
               65535.0;
        }
      }
      break;
    case 4:
      for (; input_pixel_index < iVar7; input_pixel_index = input_pixel_index + 1) {
        iVar6 = stbir__edge_wrap(edge,input_pixel_index,max);
        for (alpha_channel = 0; alpha_channel < iVar1; alpha_channel = alpha_channel + 1) {
          pfVar8[input_pixel_index * iVar1 + alpha_channel] =
               (float)((double)*(uint *)((long)pvVar5 +
                                        (long)(iVar6 * iVar1 + alpha_channel) * 4 + lVar9) /
                      4294967295.0);
        }
      }
      break;
    case 5:
      for (; input_pixel_index < iVar7; input_pixel_index = input_pixel_index + 1) {
        iVar6 = stbir__edge_wrap(edge,input_pixel_index,max);
        for (alpha_channel = 0; alpha_channel < iVar1; alpha_channel = alpha_channel + 1) {
          fVar10 = stbir__srgb_to_linear
                             ((float)((double)*(uint *)((long)pvVar5 +
                                                       (long)(iVar6 * iVar1 + alpha_channel) * 4 +
                                                       lVar9) / 4294967295.0));
          pfVar8[input_pixel_index * iVar1 + alpha_channel] = fVar10;
        }
        if ((stbir_info->flags & 2) == 0) {
          pfVar8[input_pixel_index * iVar1 + iVar2] =
               (float)((double)*(uint *)((long)pvVar5 + (long)(iVar6 * iVar1 + iVar2) * 4 + lVar9) /
                      4294967295.0);
        }
      }
      break;
    case 6:
      for (; input_pixel_index < iVar7; input_pixel_index = input_pixel_index + 1) {
        iVar6 = stbir__edge_wrap(edge,input_pixel_index,max);
        for (alpha_channel = 0; alpha_channel < iVar1; alpha_channel = alpha_channel + 1) {
          pfVar8[input_pixel_index * iVar1 + alpha_channel] =
               *(float *)((long)pvVar5 + (long)(iVar6 * iVar1 + alpha_channel) * 4 + lVar9);
        }
      }
      break;
    case 7:
      for (; input_pixel_index < iVar7; input_pixel_index = input_pixel_index + 1) {
        iVar6 = stbir__edge_wrap(edge,input_pixel_index,max);
        for (alpha_channel = 0; alpha_channel < iVar1; alpha_channel = alpha_channel + 1) {
          fVar10 = stbir__srgb_to_linear
                             (*(float *)((long)pvVar5 +
                                        (long)(iVar6 * iVar1 + alpha_channel) * 4 + lVar9));
          pfVar8[input_pixel_index * iVar1 + alpha_channel] = fVar10;
        }
        if ((stbir_info->flags & 2) == 0) {
          pfVar8[input_pixel_index * iVar1 + iVar2] =
               *(float *)((long)pvVar5 + (long)(iVar6 * iVar1 + iVar2) * 4 + lVar9);
        }
      }
      break;
    default:
      __assert_fail("!\"Unknown type/colorspace/channels combination.\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/ruidfigueiredo[P]mesmerize-viewer/vendor/stb/stb/stb_image_resize.h"
                    ,0x559,"void stbir__decode_scanline(stbir__info *, int)");
    }
    if ((stbir_info->flags & 1) == 0) {
      for (input_pixel_index = -stbir_info->horizontal_filter_pixel_margin;
          input_pixel_index < iVar7; input_pixel_index = input_pixel_index + 1) {
        iVar6 = input_pixel_index * iVar1;
        local_ac = pfVar8[iVar6 + iVar2];
        if (stbir_info->type != STBIR_TYPE_FLOAT) {
          local_ac = local_ac + 8.271806e-25;
          pfVar8[iVar6 + iVar2] = local_ac;
        }
        for (alpha_channel = 0; alpha_channel < iVar1; alpha_channel = alpha_channel + 1) {
          if (alpha_channel != iVar2) {
            pfVar8[iVar6 + alpha_channel] = local_ac * pfVar8[iVar6 + alpha_channel];
          }
        }
      }
    }
    if (edge == STBIR_EDGE_ZERO) {
      for (input_pixel_index = -stbir_info->horizontal_filter_pixel_margin; input_pixel_index < 0;
          input_pixel_index = input_pixel_index + 1) {
        for (alpha_channel = 0; alpha_channel < iVar1; alpha_channel = alpha_channel + 1) {
          pfVar8[input_pixel_index * iVar1 + alpha_channel] = 0.0;
        }
      }
      while (input_pixel_index = max, input_pixel_index < iVar7) {
        for (alpha_channel = 0; alpha_channel < iVar1; alpha_channel = alpha_channel + 1) {
          pfVar8[input_pixel_index * iVar1 + alpha_channel] = 0.0;
        }
        max = input_pixel_index + 1;
      }
    }
  }
  return;
}

Assistant:

static void stbir__decode_scanline(stbir__info* stbir_info, int n)
{
    int c;
    int channels = stbir_info->channels;
    int alpha_channel = stbir_info->alpha_channel;
    int type = stbir_info->type;
    int colorspace = stbir_info->colorspace;
    int input_w = stbir_info->input_w;
    size_t input_stride_bytes = stbir_info->input_stride_bytes;
    float* decode_buffer = stbir__get_decode_buffer(stbir_info);
    stbir_edge edge_horizontal = stbir_info->edge_horizontal;
    stbir_edge edge_vertical = stbir_info->edge_vertical;
    size_t in_buffer_row_offset = stbir__edge_wrap(edge_vertical, n, stbir_info->input_h) * input_stride_bytes;
    const void* input_data = (char *) stbir_info->input_data + in_buffer_row_offset;
    int max_x = input_w + stbir_info->horizontal_filter_pixel_margin;
    int decode = STBIR__DECODE(type, colorspace);

    int x = -stbir_info->horizontal_filter_pixel_margin;

    // special handling for STBIR_EDGE_ZERO because it needs to return an item that doesn't appear in the input,
    // and we want to avoid paying overhead on every pixel if not STBIR_EDGE_ZERO
    if (edge_vertical == STBIR_EDGE_ZERO && (n < 0 || n >= stbir_info->input_h))
    {
        for (; x < max_x; x++)
            for (c = 0; c < channels; c++)
                decode_buffer[x*channels + c] = 0;
        return;
    }

    switch (decode)
    {
    case STBIR__DECODE(STBIR_TYPE_UINT8, STBIR_COLORSPACE_LINEAR):
        for (; x < max_x; x++)
        {
            int decode_pixel_index = x * channels;
            int input_pixel_index = stbir__edge_wrap(edge_horizontal, x, input_w) * channels;
            for (c = 0; c < channels; c++)
                decode_buffer[decode_pixel_index + c] = ((float)((const unsigned char*)input_data)[input_pixel_index + c]) / stbir__max_uint8_as_float;
        }
        break;

    case STBIR__DECODE(STBIR_TYPE_UINT8, STBIR_COLORSPACE_SRGB):
        for (; x < max_x; x++)
        {
            int decode_pixel_index = x * channels;
            int input_pixel_index = stbir__edge_wrap(edge_horizontal, x, input_w) * channels;
            for (c = 0; c < channels; c++)
                decode_buffer[decode_pixel_index + c] = stbir__srgb_uchar_to_linear_float[((const unsigned char*)input_data)[input_pixel_index + c]];

            if (!(stbir_info->flags&STBIR_FLAG_ALPHA_USES_COLORSPACE))
                decode_buffer[decode_pixel_index + alpha_channel] = ((float)((const unsigned char*)input_data)[input_pixel_index + alpha_channel]) / stbir__max_uint8_as_float;
        }
        break;

    case STBIR__DECODE(STBIR_TYPE_UINT16, STBIR_COLORSPACE_LINEAR):
        for (; x < max_x; x++)
        {
            int decode_pixel_index = x * channels;
            int input_pixel_index = stbir__edge_wrap(edge_horizontal, x, input_w) * channels;
            for (c = 0; c < channels; c++)
                decode_buffer[decode_pixel_index + c] = ((float)((const unsigned short*)input_data)[input_pixel_index + c]) / stbir__max_uint16_as_float;
        }
        break;

    case STBIR__DECODE(STBIR_TYPE_UINT16, STBIR_COLORSPACE_SRGB):
        for (; x < max_x; x++)
        {
            int decode_pixel_index = x * channels;
            int input_pixel_index = stbir__edge_wrap(edge_horizontal, x, input_w) * channels;
            for (c = 0; c < channels; c++)
                decode_buffer[decode_pixel_index + c] = stbir__srgb_to_linear(((float)((const unsigned short*)input_data)[input_pixel_index + c]) / stbir__max_uint16_as_float);

            if (!(stbir_info->flags&STBIR_FLAG_ALPHA_USES_COLORSPACE))
                decode_buffer[decode_pixel_index + alpha_channel] = ((float)((const unsigned short*)input_data)[input_pixel_index + alpha_channel]) / stbir__max_uint16_as_float;
        }
        break;

    case STBIR__DECODE(STBIR_TYPE_UINT32, STBIR_COLORSPACE_LINEAR):
        for (; x < max_x; x++)
        {
            int decode_pixel_index = x * channels;
            int input_pixel_index = stbir__edge_wrap(edge_horizontal, x, input_w) * channels;
            for (c = 0; c < channels; c++)
                decode_buffer[decode_pixel_index + c] = (float)(((double)((const unsigned int*)input_data)[input_pixel_index + c]) / stbir__max_uint32_as_float);
        }
        break;

    case STBIR__DECODE(STBIR_TYPE_UINT32, STBIR_COLORSPACE_SRGB):
        for (; x < max_x; x++)
        {
            int decode_pixel_index = x * channels;
            int input_pixel_index = stbir__edge_wrap(edge_horizontal, x, input_w) * channels;
            for (c = 0; c < channels; c++)
                decode_buffer[decode_pixel_index + c] = stbir__srgb_to_linear((float)(((double)((const unsigned int*)input_data)[input_pixel_index + c]) / stbir__max_uint32_as_float));

            if (!(stbir_info->flags&STBIR_FLAG_ALPHA_USES_COLORSPACE))
                decode_buffer[decode_pixel_index + alpha_channel] = (float)(((double)((const unsigned int*)input_data)[input_pixel_index + alpha_channel]) / stbir__max_uint32_as_float);
        }
        break;

    case STBIR__DECODE(STBIR_TYPE_FLOAT, STBIR_COLORSPACE_LINEAR):
        for (; x < max_x; x++)
        {
            int decode_pixel_index = x * channels;
            int input_pixel_index = stbir__edge_wrap(edge_horizontal, x, input_w) * channels;
            for (c = 0; c < channels; c++)
                decode_buffer[decode_pixel_index + c] = ((const float*)input_data)[input_pixel_index + c];
        }
        break;

    case STBIR__DECODE(STBIR_TYPE_FLOAT, STBIR_COLORSPACE_SRGB):
        for (; x < max_x; x++)
        {
            int decode_pixel_index = x * channels;
            int input_pixel_index = stbir__edge_wrap(edge_horizontal, x, input_w) * channels;
            for (c = 0; c < channels; c++)
                decode_buffer[decode_pixel_index + c] = stbir__srgb_to_linear(((const float*)input_data)[input_pixel_index + c]);

            if (!(stbir_info->flags&STBIR_FLAG_ALPHA_USES_COLORSPACE))
                decode_buffer[decode_pixel_index + alpha_channel] = ((const float*)input_data)[input_pixel_index + alpha_channel];
        }

        break;

    default:
        STBIR_ASSERT(!"Unknown type/colorspace/channels combination.");
        break;
    }

    if (!(stbir_info->flags & STBIR_FLAG_ALPHA_PREMULTIPLIED))
    {
        for (x = -stbir_info->horizontal_filter_pixel_margin; x < max_x; x++)
        {
            int decode_pixel_index = x * channels;

            // If the alpha value is 0 it will clobber the color values. Make sure it's not.
            float alpha = decode_buffer[decode_pixel_index + alpha_channel];
#ifndef STBIR_NO_ALPHA_EPSILON
            if (stbir_info->type != STBIR_TYPE_FLOAT) {
                alpha += STBIR_ALPHA_EPSILON;
                decode_buffer[decode_pixel_index + alpha_channel] = alpha;
            }
#endif
            for (c = 0; c < channels; c++)
            {
                if (c == alpha_channel)
                    continue;

                decode_buffer[decode_pixel_index + c] *= alpha;
            }
        }
    }

    if (edge_horizontal == STBIR_EDGE_ZERO)
    {
        for (x = -stbir_info->horizontal_filter_pixel_margin; x < 0; x++)
        {
            for (c = 0; c < channels; c++)
                decode_buffer[x*channels + c] = 0;
        }
        for (x = input_w; x < max_x; x++)
        {
            for (c = 0; c < channels; c++)
                decode_buffer[x*channels + c] = 0;
        }
    }
}